

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Reader * __thiscall
capnp::Orphan<capnp::DynamicValue>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  bool bVar1;
  uint16_t uVar2;
  SegmentReader *pSVar3;
  RawBrandedSchema *pRVar4;
  ulong uVar5;
  size_t sVar6;
  ElementSize elementSize;
  Which elementType;
  uint uVar7;
  int64_t iVar8;
  ushort uVar9;
  ArrayPtr<const_unsigned_char> AVar10;
  Fault f;
  Schema local_c0;
  Reader local_b8;
  StructReader local_88;
  ListReader local_58;
  
  switch(this->type) {
  case UNKNOWN:
    __return_storage_ptr__->type = UNKNOWN;
    break;
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar1 = (this->field_1).boolValue;
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = bVar1;
    break;
  case INT:
    iVar8 = (this->field_1).intValue;
    __return_storage_ptr__->type = INT;
    goto LAB_0018a90a;
  case UINT:
    iVar8 = (this->field_1).intValue;
    __return_storage_ptr__->type = UINT;
LAB_0018a90a:
    (__return_storage_ptr__->field_1).intValue = iVar8;
    break;
  case FLOAT:
    iVar8 = (this->field_1).intValue;
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = iVar8;
    break;
  case TEXT:
    AVar10 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asTextReader(&this->builder);
    __return_storage_ptr__->type = TEXT;
    goto LAB_0018a95a;
  case DATA:
    AVar10 = (ArrayPtr<const_unsigned_char>)capnp::_::OrphanBuilder::asDataReader(&this->builder);
    __return_storage_ptr__->type = DATA;
LAB_0018a95a:
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<const_unsigned_char> = AVar10;
    break;
  case LIST:
    uVar5 = (this->field_1).uintValue;
    sVar6 = *(size_t *)((long)&this->field_1 + 8);
    elementType = LIST;
    if ((uVar5 & 0xff0000) == 0) {
      elementType = (Which)uVar5;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    capnp::_::OrphanBuilder::asListReader(&local_58,&this->builder,elementSize);
    *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_58.structDataSize
    ;
    *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
         local_58.structPointerCount;
    *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_58.elementSize;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_58._39_1_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_58.nestingLimit;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x3c) = local_58._44_4_;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = local_58.ptr;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_58.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_58.step;
    (__return_storage_ptr__->field_1).listValue.reader.segment = local_58.segment;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = local_58.capTable;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).uintValue = uVar5;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ = sVar6;
    break;
  case ENUM:
    iVar8 = (this->field_1).intValue;
    uVar2 = (this->field_1).enumValue.value;
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).intValue = iVar8;
    *(uint16_t *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar2;
    break;
  case STRUCT:
    pRVar4 = (RawBrandedSchema *)(this->field_1).intValue;
    local_c0.raw = pRVar4;
    Schema::getProto(&local_b8,&local_c0);
    uVar7 = 0;
    if (local_b8._reader.dataSize < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(ushort *)
               ((long)&(((CapTableBuilder *)((long)local_b8._reader.data + 8))->super_CapTableReader
                       )._vptr_CapTableReader + 6);
      if (0xcf < local_b8._reader.dataSize) {
        uVar7 = (uint)*(ushort *)
                       &(((CapTableBuilder *)((long)local_b8._reader.data + 0x18))->
                        super_CapTableReader)._vptr_CapTableReader << 0x10;
      }
    }
    capnp::_::OrphanBuilder::asStructReader(&local_88,&this->builder,(StructSize)(uVar9 | uVar7));
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.reader.elementCount =
         local_88._32_8_;
    *(int *)((long)&__return_storage_ptr__->field_1 + 0x30) = local_88.nestingLimit;
    *(undefined2 *)((long)&__return_storage_ptr__->field_1 + 0x34) = local_88._44_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_88._46_1_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_88._47_1_;
    (__return_storage_ptr__->field_1).listValue.reader.capTable = (CapTableReader *)local_88.data;
    (__return_storage_ptr__->field_1).listValue.reader.ptr = (byte *)local_88.pointers;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_88.segment;
    (__return_storage_ptr__->field_1).listValue.reader.segment = (SegmentReader *)local_88.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)pRVar4;
    break;
  case CAPABILITY:
    pSVar3 = (SegmentReader *)(this->field_1).intValue;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)&local_b8);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).intValue = (int64_t)local_b8._reader.segment;
    (__return_storage_ptr__->field_1).textValue.super_StringPtr.content.size_ =
         (size_t)local_b8._reader.capTable;
    (__return_storage_ptr__->field_1).listValue.reader.segment = pSVar3;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              ((Fault *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x85a,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_b8);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader Orphan<DynamicValue>::getReader() const {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asTextReader();
    case DynamicValue::DATA: return builder.asDataReader();
    case DynamicValue::LIST:
      return DynamicList::Reader(listSchema,
          builder.asListReader(elementSizeFor(listSchema.whichElementType())));
    case DynamicValue::STRUCT:
      return DynamicStruct::Reader(structSchema,
          builder.asStructReader(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                     "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}